

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trend_suite.cpp
# Opt level: O0

void double_suite::test_linear_increase_offset(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  double absolute_tolerance;
  double *in_stack_ffffffffffffff68;
  double local_88;
  value_type local_80;
  size_type local_78;
  double local_68;
  value_type local_60;
  size_type local_58;
  double local_48;
  value_type local_40;
  undefined1 local_38 [8];
  trend<double> filter;
  close_to<double> tolerance;
  
  absolute_tolerance = std::numeric_limits<double>::min();
  trial::online::detail::close_to<double>::close_to
            ((close_to<double> *)&filter.grand.member.count,1e-05,absolute_tolerance);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::basic_trend
            ((basic_trend<double,_(trial::online::with)1> *)local_38);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,10.0);
  local_40 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                       ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_48 = 10.0;
  local_58 = filter.grand.member.count;
  predicate_01.absolute = tolerance.relative;
  predicate_01.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","10.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x54,0x106338,(char *)&local_40,&local_48,in_stack_ffffffffffffff68,
             predicate_01);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,11.0);
  local_60 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                       ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_68 = 11.0;
  local_78 = filter.grand.member.count;
  predicate_00.absolute = tolerance.relative;
  predicate_00.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","11.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x56,0x106338,(char *)&local_60,&local_68,in_stack_ffffffffffffff68,
             predicate_00);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,12.0);
  local_80 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                       ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_88 = 12.0;
  predicate.absolute = tolerance.relative;
  predicate.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","12.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x58,0x106338,(char *)&local_80,&local_88,(double *)filter.grand.member.count,
             predicate);
  return;
}

Assistant:

void test_linear_increase_offset()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    cumulative::trend<double> filter;

    filter.push(10.0);
    TRIAL_TEST_WITH(filter.value(), 10.0, tolerance);
    filter.push(11.0);
    TRIAL_TEST_WITH(filter.value(), 11.0, tolerance);
    filter.push(12.0);
    TRIAL_TEST_WITH(filter.value(), 12.0, tolerance);
}